

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall
dynamicgraph::command::Command::setParameterValues
          (Command *this,
          vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
          *values)

{
  Type TVar1;
  size_type sVar2;
  size_type sVar3;
  ExceptionAbstract *pEVar4;
  ulong uVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  ostream *poVar8;
  Type type;
  Type type_00;
  string local_258;
  int local_234;
  string local_230;
  string local_210;
  stringstream local_1f0 [8];
  stringstream ss;
  ostream local_1e0 [380];
  uint local_64;
  undefined1 local_5d;
  uint iParam;
  allocator<char> local_49;
  string local_48;
  int local_24;
  vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  *local_20;
  vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
  *paramTypes;
  vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_> *values_local;
  Command *this_local;
  
  paramTypes = (vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
                *)values;
  values_local = (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                  *)this;
  local_20 = valueTypes(this);
  sVar2 = std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
          size((vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                *)paramTypes);
  sVar3 = std::
          vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
          ::size(local_20);
  if (sVar2 != sVar3) {
    local_5d = 1;
    pEVar4 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
    local_24 = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"wrong number of parameters",&local_49);
    ExceptionAbstract::ExceptionAbstract(pEVar4,&local_24,&local_48);
    local_5d = 0;
    __cxa_throw(pEVar4,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
  }
  local_64 = 0;
  while( true ) {
    uVar5 = (ulong)local_64;
    sVar2 = std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
            ::size((vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                    *)paramTypes);
    if (sVar2 <= uVar5) {
      std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
      operator=(&this->valueVector_,
                (vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                 *)paramTypes);
      return;
    }
    pvVar6 = std::
             vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>::
             operator[]((vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                         *)paramTypes,(ulong)local_64);
    TVar1 = Value::type(pvVar6);
    pvVar7 = std::
             vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
             ::operator[](local_20,(ulong)local_64);
    if (TVar1 != *pvVar7) break;
    local_64 = local_64 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_1f0);
  poVar8 = std::operator<<(local_1e0,"argument ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_64);
  poVar8 = std::operator<<(poVar8," is of wrong type: ");
  pvVar7 = std::
           vector<dynamicgraph::command::Value::Type,_std::allocator<dynamicgraph::command::Value::Type>_>
           ::operator[](local_20,(ulong)local_64);
  Value::typeName_abi_cxx11_(&local_210,(Value *)(ulong)*pvVar7,type);
  poVar8 = std::operator<<(poVar8,(string *)&local_210);
  poVar8 = std::operator<<(poVar8," expected, got ");
  pvVar6 = std::vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
           ::operator[]((vector<dynamicgraph::command::Value,_std::allocator<dynamicgraph::command::Value>_>
                         *)paramTypes,(ulong)local_64);
  TVar1 = Value::type(pvVar6);
  Value::typeName_abi_cxx11_(&local_230,(Value *)(ulong)TVar1,type_00);
  std::operator<<(poVar8,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  pEVar4 = (ExceptionAbstract *)__cxa_allocate_exception(0x30);
  local_234 = 700;
  std::__cxx11::stringstream::str();
  ExceptionAbstract::ExceptionAbstract(pEVar4,&local_234,&local_258);
  __cxa_throw(pEVar4,&ExceptionAbstract::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

void Command::setParameterValues(const std::vector<Value> &values) {
  const std::vector<Value::Type> &paramTypes = valueTypes();
  // Check that number of parameters is correct
  if (values.size() != paramTypes.size()) {
    throw ExceptionAbstract(ExceptionAbstract::ABSTRACT,
                            "wrong number of parameters");
  }
  // Check that each parameter is of correct type
  for (unsigned int iParam = 0; iParam < values.size(); iParam++) {
    if (values[iParam].type() != paramTypes[iParam]) {
      std::stringstream ss;
      ss << "argument " << iParam
         << " is of wrong type: " << Value::typeName(paramTypes[iParam])
         << " expected, got " << Value::typeName(values[iParam].type());
      throw ExceptionAbstract(ExceptionAbstract::TOOLS, ss.str());
    }
  }
  // Copy vector of values in private part
  valueVector_ = values;
}